

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcfinal.c
# Opt level: O2

LispPTR mergebackward(LispPTR base)

{
  LispPTR *pLVar1;
  LispPTR base_00;
  
  if (base == 0) {
    base = 0;
  }
  else {
    pLVar1 = NativeAligned4FromLAddr(base - 2);
    if ((((*ArrayMerging_word == 0) || (*ArraySpace_word == base)) || (*ArraySpace2_word == base))
       || ((*pLVar1 & 0x10000) != 0)) {
      linkblock(base);
    }
    else {
      base_00 = base + (uint)(ushort)*pLVar1 * -2;
      checkarrayblock(base_00,1,0);
      deleteblock(base_00);
      arrayblockmerger(base_00,base);
      base = base_00;
    }
  }
  return base;
}

Assistant:

LispPTR mergebackward(LispPTR base) {
  LispPTR pbase;
  struct arrayblock *ptrailer;

  if (base == NIL)
    return (NIL);
  ptrailer = (struct arrayblock *)NativeAligned4FromLAddr(base - ARRAYBLOCKTRAILERWORDS);
  if ((*ArrayMerging_word == NIL) ||
           ((base == *ArraySpace_word) || ((base == *ArraySpace2_word) || (ptrailer->inuse == T))))
    return (linkblock(base));
  pbase = base - 2 * ptrailer->arlen;
  checkarrayblock(pbase, T, NIL);
  deleteblock(pbase);
  return (arrayblockmerger(pbase, base));
}